

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::~cmQtAutoGenerator(cmQtAutoGenerator *this)

{
  code *pcVar1;
  cmQtAutoGenerator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cmQtAutoGenerator::~cmQtAutoGenerator() = default;